

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O3

void Abc_NtkPrintMiter(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  long *plVar2;
  ulong uVar3;
  int iVar4;
  Abc_Obj_t *pAVar5;
  long lVar6;
  char *pcVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  Abc_Obj_t *pAVar13;
  uint uVar14;
  uint uVar15;
  timespec ts;
  timespec local_40;
  
  pAVar5 = Abc_AigConst1(pNtk);
  iVar4 = clock_gettime(3,&local_40);
  if (iVar4 < 0) {
    lVar8 = 1;
  }
  else {
    lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar8 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  lVar6 = (long)pNtk->vPis->nSize;
  uVar14 = 0;
  uVar12 = 0;
  if (0 < lVar6) {
    lVar9 = 0;
    uVar12 = 0;
    do {
      uVar12 = (ulong)((int)uVar12 + (uint)(0 < *(int *)((long)pNtk->vPis->pArray[lVar9] + 0x2c)));
      lVar9 = lVar9 + 1;
    } while (lVar6 != lVar9);
  }
  lVar6 = (long)pNtk->vPos->nSize;
  if (lVar6 < 1) {
    uVar11 = 0xffffffff;
    uVar15 = 0;
    uVar10 = 0;
  }
  else {
    uVar11 = 0xffffffff;
    lVar9 = 0;
    uVar10 = 0;
    uVar15 = 0;
    uVar14 = 0;
    do {
      plVar2 = (long *)pNtk->vPos->pArray[lVar9];
      uVar3 = *(ulong *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8);
      pAVar13 = (Abc_Obj_t *)(*(uint *)((long)plVar2 + 0x14) >> 10 & 1 ^ uVar3);
      if (((ulong)pAVar13 ^ (ulong)pAVar5) == 1) {
        uVar14 = uVar14 + 1;
      }
      else if (((pAVar5 == pAVar13) ||
               (uVar1 = *(uint *)((uVar3 & 0xfffffffffffffffe) + 0x14), (uVar1 & 0xf) == 2)) ||
              ((((uint)pAVar13 ^ uVar1 >> 7) & 1) != 0)) {
        uVar15 = uVar15 + 1;
        if (uVar11 == 0xffffffff) {
          uVar11 = (uint)lVar9;
        }
      }
      else {
        uVar10 = uVar10 + 1;
      }
      lVar9 = lVar9 + 1;
    } while (lVar6 != lVar9);
  }
  printf("Miter:  I =%6d",uVar12);
  printf("  N =%7d",(ulong)(uint)pNtk->nObjCounts[7]);
  printf("  ? =%7d",(ulong)uVar10);
  printf("  U =%6d",(ulong)uVar14);
  printf("  S =%6d",(ulong)uVar15);
  iVar4 = clock_gettime(3,&local_40);
  if (iVar4 < 0) {
    lVar6 = -1;
  }
  else {
    lVar6 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  printf(" %7.2f sec\n",(double)((float)(lVar6 + lVar8) / 1e+06));
  if (-1 < (int)uVar11) {
    if (pNtk->vPos->nSize <= (int)uVar11) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    pcVar7 = Abc_ObjName((Abc_Obj_t *)pNtk->vPos->pArray[uVar11]);
    printf("The first satisfiable output is number %d (%s).\n",(ulong)uVar11,pcVar7);
  }
  return;
}

Assistant:

void Abc_NtkPrintMiter( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj, * pChild, * pConst1 = Abc_AigConst1(pNtk);
    int i, iOut = -1;
    abctime Time = Abc_Clock();
    int nUnsat = 0;
    int nSat   = 0;
    int nUndec = 0;
    int nPis   = 0;
    Abc_NtkForEachPi( pNtk, pObj, i )
        nPis += (int)( Abc_ObjFanoutNum(pObj) > 0 );
    Abc_NtkForEachPo( pNtk, pObj, i )
    {
        pChild = Abc_ObjChild0(pObj);
        // check if the output is constant 0
        if ( pChild == Abc_ObjNot(pConst1) )
            nUnsat++;
        // check if the output is constant 1
        else if ( pChild == pConst1 )
        {
            nSat++;
            if ( iOut == -1 )
                iOut = i;
        }
        // check if the output is a primary input
        else if ( Abc_ObjIsPi(Abc_ObjRegular(pChild)) )
        {
            nSat++;
            if ( iOut == -1 )
                iOut = i;
        }
    // check if the output is 1 for the 0000 pattern
        else if ( Abc_ObjRegular(pChild)->fPhase != (unsigned)Abc_ObjIsComplement(pChild) )
        {
            nSat++;
            if ( iOut == -1 )
                iOut = i;
        }
        else
            nUndec++;
    }
    printf( "Miter:  I =%6d", nPis );
    printf( "  N =%7d", Abc_NtkNodeNum(pNtk) );
    printf( "  ? =%7d", nUndec );
    printf( "  U =%6d", nUnsat );
    printf( "  S =%6d", nSat );
    Time = Abc_Clock() - Time;
    printf(" %7.2f sec\n", (float)(Time)/(float)(CLOCKS_PER_SEC));
    if ( iOut >= 0 )
        printf( "The first satisfiable output is number %d (%s).\n", iOut, Abc_ObjName( Abc_NtkPo(pNtk, iOut) ) );
}